

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O2

iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
* __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *args,
          int *args_1)

{
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> begin
  ;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> end;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_128;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_e8;
  istream_type *local_a8;
  int local_a0;
  undefined1 local_9c;
  istream_type *local_98;
  int local_90;
  undefined1 local_8c;
  difference_type local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  buffer_value_type *local_70;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_68;
  
  make_buffered_chunk_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,int>
            (&local_128,(burst *)args,
             (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
             (ulong)(uint)*args_1,(int)args_1);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  buffered_chunk_iterator(&local_68,&local_128);
  local_a8 = local_128.m_current._M_stream;
  local_a0 = local_128.m_current._M_value;
  local_9c = local_128.m_current._M_ok;
  local_98 = local_128.m_end._M_stream;
  local_90 = local_128.m_end._M_value;
  local_8c = local_128.m_end._M_ok;
  local_88 = local_128.m_chunk_size;
  local_80 = local_128.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_78._M_pi =
       local_128.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_128.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_128.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = local_128.m_chunk_end;
  local_e8.m_current._M_stream = local_68.m_current._M_stream;
  local_e8.m_current._M_value = local_68.m_current._M_value;
  local_e8.m_current._M_ok = local_68.m_current._M_ok;
  local_e8.m_end._M_stream = local_68.m_end._M_stream;
  local_e8.m_end._M_value = local_68.m_end._M_value;
  local_e8.m_end._M_ok = local_68.m_end._M_ok;
  local_e8.m_chunk_size = local_68.m_chunk_size;
  local_e8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_68.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_68.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_68.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_68.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.m_chunk_end = local_68.m_chunk_end;
  boost::
  make_iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>>
            (__return_storage_ptr__,(boost *)&local_a8,&local_e8,
             (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)args_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }